

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,false,true>
               (timestamp_t *ldata,interval_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  Interval *pIVar3;
  int64_t iVar4;
  ulong uVar5;
  timestamp_t tVar6;
  ulong uVar7;
  timestamp_t *ptVar8;
  timestamp_t *extraout_RDX;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  idx_t iVar12;
  interval_t iVar13;
  interval_t interval;
  interval_t interval_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      pIVar3 = *(Interval **)rdata;
      iVar4 = rdata->micros;
      iVar12 = 0;
      ptVar8 = result_data;
      do {
        tVar6.value = ldata[iVar12].value;
        iVar13.micros = (int64_t)ptVar8;
        iVar13._0_8_ = iVar4;
        iVar13 = Interval::Invert(pIVar3,iVar13);
        tVar6 = Interval::Add(tVar6,iVar13);
        result_data[iVar12].value = tVar6.value;
        iVar12 = iVar12 + 1;
        ptVar8 = extraout_RDX;
      } while (count != iVar12);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar9 = 0;
    uVar7 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar11 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar11 = count;
        }
LAB_00990e14:
        uVar5 = uVar9;
        if (uVar9 < uVar11) {
          pIVar3 = *(Interval **)rdata;
          iVar4 = rdata->micros;
          do {
            tVar6.value = ldata[uVar9].value;
            interval.micros = (int64_t)result_data;
            interval._0_8_ = iVar4;
            iVar13 = Interval::Invert(pIVar3,interval);
            tVar6 = Interval::Add(tVar6,iVar13);
            result_data[uVar9].value = tVar6.value;
            uVar9 = uVar9 + 1;
            uVar5 = uVar11;
          } while (uVar11 != uVar9);
        }
      }
      else {
        uVar2 = puVar1[uVar7];
        uVar11 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar11 = count;
        }
        uVar5 = uVar11;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_00990e14;
          uVar5 = uVar9;
          if (uVar9 < uVar11) {
            uVar10 = 0;
            do {
              if ((uVar2 >> (uVar10 & 0x3f) & 1) != 0) {
                tVar6.value = ldata[uVar9 + uVar10].value;
                interval_00.micros = (int64_t)result_data;
                interval_00._0_8_ = rdata->micros;
                iVar13 = Interval::Invert(*(Interval **)rdata,interval_00);
                tVar6 = Interval::Add(tVar6,iVar13);
                result_data[uVar9 + uVar10].value = tVar6.value;
              }
              uVar10 = uVar10 + 1;
              uVar5 = uVar11;
            } while (uVar11 - uVar9 != uVar10);
          }
        }
      }
      uVar9 = uVar5;
      uVar7 = uVar7 + 1;
    } while (uVar7 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}